

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

bool check_somatic(CHAR_DATA *ch)

{
  int iVar1;
  int iVar2;
  void *in_RDI;
  int skill;
  CHAR_DATA *unaff_retaddr;
  int in_stack_000000c4;
  bool in_stack_000000cb;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000000ec;
  CHAR_DATA *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  bool bVar3;
  
  iVar1 = get_skill(in_stack_000000f0,in_stack_000000ec);
  if (iVar1 < 5) {
    bVar3 = false;
  }
  else {
    iVar1 = (int)((float)iVar1 * 0.75);
    WAIT_STATE(unaff_retaddr,in_stack_fffffffffffffffc);
    iVar2 = number_percent();
    if (iVar1 < iVar2) {
      act((char *)unaff_retaddr,
          (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
      send_to_char((char *)unaff_retaddr,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      bVar3 = false;
    }
    else {
      act((char *)unaff_retaddr,
          (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
      act((char *)unaff_retaddr,
          (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
          (void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),0);
      check_improve(in_stack_000000d0,in_stack_000000cc,in_stack_000000cb,in_stack_000000c4);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool check_somatic(CHAR_DATA *ch)
{
	int skill = get_skill(ch, gsn_somatic_casting);

	if (skill < 5)
		return false;

	skill = (int)((float)skill * 0.75);

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (number_percent() > skill)
	{
		act("$n gestures and focuses intently for a moment, but nothing happens.", ch, 0, 0, TO_ROOM);
		send_to_char("You fail to complete the incantation by using somatic gestures.\n\r", ch);
		return false;
	}

	act("$n concentrates intently as $e gestures with $s hands.", ch, 0, 0, TO_ROOM);
	act("You focus intently, using somatic gestures to complete the incantation.", ch, 0, 0, TO_CHAR);

	check_improve(ch, gsn_somatic_casting, true, 6);

	return true;
}